

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O1

spv_result_t spvtools::val::ModuleLayoutPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ModuleLayoutSection MVar4;
  spv_result_t sVar5;
  DiagnosticStream *pDVar6;
  long lVar7;
  Op opcode;
  spv_result_t unaff_EBP;
  char *pcVar8;
  char *local_208;
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  MVar4 = ValidationState_t::current_layout_section(_);
  if (kLayoutTypes < MVar4) {
    if (1 < MVar4 - kLayoutFunctionDeclarations) {
      return SPV_SUCCESS;
    }
    sVar5 = anon_unknown_3::FunctionScopedInstructions(_,inst,opcode);
    goto joined_r0x002f9514;
  }
  if ((opcode != OpExtInstWithForwardRefsKHR) && (opcode != OpExtInst)) goto LAB_002f961a;
  bVar3 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type);
  if (bVar3) {
    uVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[4];
    bVar3 = (uVar2 & 0xfffffffe) == 0x1c || uVar2 - 0x17 < 2;
    if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      bVar3 = bVar3 || (uVar2 == 0x65 || uVar2 - 0x67 < 2);
    }
    if (bVar3) {
      bVar3 = ValidationState_t::in_function_body(_);
      if (bVar3) goto LAB_002f9610;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"of debug info extension must appear in a function ",0x32);
      pcVar8 = "body";
      lVar7 = 4;
LAB_002f95ae:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar8,lVar7);
      DiagnosticStream::~DiagnosticStream(&local_200);
      bVar3 = false;
    }
    else {
      MVar4 = ValidationState_t::current_layout_section(_);
      if (((int)MVar4 < 0xb) ||
         (MVar4 = ValidationState_t::current_layout_section(_), 0xb < (int)MVar4)) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_200,"Debug info extension instructions other than ",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_200,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ",0x33)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_200,"must appear between section 9 (types, constants, ",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_200,"global variables) and section 10 (function ",0x2b);
        pcVar8 = "declarations)";
        lVar7 = 0xd;
        goto LAB_002f95ae;
      }
LAB_002f9610:
      bVar3 = true;
      local_200.error_ = unaff_EBP;
    }
    sVar5 = local_200.error_;
    if (!bVar3) goto joined_r0x002f9514;
LAB_002f961a:
    bVar3 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode);
    sVar5 = SPV_SUCCESS;
    while (bVar3 == false) {
      bVar3 = ValidationState_t::IsOpcodeInPreviousLayoutSection(_,opcode);
      if (bVar3) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
        local_208 = spvOpcodeString(opcode);
        pDVar6 = DiagnosticStream::operator<<(&local_200,&local_208);
        pcVar8 = " is in an invalid layout section";
        lVar7 = 0x20;
        goto LAB_002f96f3;
      }
      ValidationState_t::ProgressToNextLayoutSectionOrder(_);
      MVar4 = ValidationState_t::current_layout_section(_);
      if (MVar4 == kLayoutMemoryModel) {
        if (uVar1 != 0xe) {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
          local_208 = spvOpcodeString(opcode);
          pDVar6 = DiagnosticStream::operator<<(&local_200,&local_208);
          pcVar8 = " cannot appear before the memory model instruction";
          lVar7 = 0x32;
          goto LAB_002f96f3;
        }
      }
      else if (MVar4 == kLayoutFunctionDeclarations) {
        sVar5 = ModuleLayoutPass(_,inst);
        break;
      }
      bVar3 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode);
    }
  }
  else {
    bVar3 = spvExtInstIsNonSemantic((inst->inst_).ext_inst_type);
    MVar4 = ValidationState_t::current_layout_section(_);
    if (bVar3) {
      if (10 < (int)MVar4) goto LAB_002f961a;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"Non-semantic OpExtInst must not appear before types ",0x34);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"section",7);
      sVar5 = local_200.error_;
    }
    else {
      if (0xc < (int)MVar4) goto LAB_002f961a;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_LAYOUT,inst);
      local_208 = spvOpcodeString(opcode);
      pDVar6 = DiagnosticStream::operator<<(&local_200,&local_208);
      pcVar8 = " must appear in a block";
      lVar7 = 0x17;
LAB_002f96f3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6,pcVar8,lVar7);
      sVar5 = pDVar6->error_;
    }
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
joined_r0x002f9514:
  if (sVar5 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar5;
}

Assistant:

spv_result_t ModuleLayoutPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (_.current_layout_section()) {
    case kLayoutCapabilities:
    case kLayoutExtensions:
    case kLayoutExtInstImport:
    case kLayoutMemoryModel:
    case kLayoutSamplerImageAddressMode:
    case kLayoutEntryPoint:
    case kLayoutExecutionMode:
    case kLayoutDebug1:
    case kLayoutDebug2:
    case kLayoutDebug3:
    case kLayoutAnnotations:
    case kLayoutTypes:
      if (auto error = ModuleScopedInstructions(_, inst, opcode)) return error;
      break;
    case kLayoutFunctionDeclarations:
    case kLayoutFunctionDefinitions:
      if (auto error = FunctionScopedInstructions(_, inst, opcode)) {
        return error;
      }
      break;
  }
  return SPV_SUCCESS;
}